

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor0.c
# Opt level: O2

int floor0_inverse2(vorbis_block *vb,vorbis_look_floor *i,void *memo,float *out)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  float fVar17;
  float fVar18;
  
  lVar5 = *(long *)((long)i + 8);
  lVar2 = *(long *)((long)i + 0x18);
  if (*(long *)(lVar5 + vb->W * 8) == 0) {
    lVar8 = (long)(int)vb->W;
    uVar3 = *(long *)((long)vb->vd->vi->codec_setup + lVar8 * 8) / 2;
    iVar1 = *i;
    dVar13 = atan((double)((float)*(long *)(lVar2 + 8) * 0.5 * 0.00074));
    fVar11 = (float)*(long *)(lVar2 + 8) * 0.5;
    dVar14 = atan((double)(fVar11 * fVar11 * 1.85e-08));
    lVar5 = *(long *)(lVar2 + 8);
    fVar11 = (float)lVar5;
    pvVar4 = malloc((long)((uVar3 << 0x20) + 0x100000000) >> 0x1e);
    iVar6 = (int)uVar3;
    fVar12 = (float)iVar6;
    *(void **)(*(long *)((long)i + 8) + lVar8 * 8) = pvVar4;
    uVar10 = 0;
    uVar9 = 0;
    if (0 < iVar6) {
      uVar9 = uVar3 & 0xffffffff;
    }
    for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      fVar17 = (float)(int)uVar10;
      dVar15 = atan((double)((((float)lVar5 * 0.5) / fVar12) * fVar17 * 0.00074));
      fVar18 = (((float)*(long *)(lVar2 + 8) * 0.5) / fVar12) * fVar17;
      dVar16 = atan((double)(fVar18 * fVar18 * 1.85e-08));
      lVar5 = *(long *)(lVar2 + 8);
      dVar15 = floor((dVar16 * 2.240000009536743 + dVar15 * 13.100000381469727 +
                     (double)((((float)lVar5 * 0.5) / fVar12) * fVar17 * 0.0001)) *
                     (double)(float)((double)iVar1 /
                                    ((double)(fVar11 * 0.5 * 0.0001) +
                                    dVar13 * 13.100000381469727 + dVar14 * 2.240000009536743)));
      iVar7 = *i + -1;
      if ((int)dVar15 < *i) {
        iVar7 = (int)dVar15;
      }
      *(int *)(*(long *)(*(long *)((long)i + 8) + lVar8 * 8) + uVar10 * 4) = iVar7;
    }
    lVar5 = *(long *)((long)i + 8);
    *(undefined4 *)(*(long *)(lVar5 + lVar8 * 8) + uVar9 * 4) = 0xffffffff;
    *(int *)((long)i + lVar8 * 4 + 0x10) = iVar6;
  }
  if (memo == (void *)0x0) {
    memset(out,0,(long)*(int *)((long)i + vb->W * 4 + 0x10) << 2);
  }
  else {
    vorbis_lsp_to_curve(out,*(int **)(lVar5 + vb->W * 8),*(int *)((long)i + vb->W * 4 + 0x10),*i,
                        (float *)memo,*(int *)((long)i + 4),
                        *(float *)((long)memo + (long)*(int *)((long)i + 4) * 4),
                        (float)*(int *)(lVar2 + 0x1c));
  }
  return (uint)(memo != (void *)0x0);
}

Assistant:

static int floor0_inverse2(vorbis_block *vb,vorbis_look_floor *i,
                           void *memo,float *out){
  vorbis_look_floor0 *look=(vorbis_look_floor0 *)i;
  vorbis_info_floor0 *info=look->vi;

  floor0_map_lazy_init(vb,info,look);

  if(memo){
    float *lsp=(float *)memo;
    float amp=lsp[look->m];

    /* take the coefficients back to a spectral envelope curve */
    vorbis_lsp_to_curve(out,
                        look->linearmap[vb->W],
                        look->n[vb->W],
                        look->ln,
                        lsp,look->m,amp,(float)info->ampdB);
    return(1);
  }
  memset(out,0,sizeof(*out)*look->n[vb->W]);
  return(0);
}